

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O2

void __thiscall VariableAndMod::~VariableAndMod(VariableAndMod *this)

{
  std::__cxx11::string::~string((string *)&this->modifiers);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

VariableAndMod(string name, string mods)
      : variable_name(name), modifiers(mods) { }